

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_mismatch.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  vector<int,_std::allocator<int>_> v;
  void *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_38 = (void *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0x400000004;
  puVar2 = (undefined8 *)operator_new(0xc);
  *puVar2 = 0x400000004;
  *(undefined4 *)(puVar2 + 1) = 4;
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)&local_38,0,puVar1,(long)puVar2 + 0xc);
  operator_delete(puVar2);
  operator_delete(puVar1);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  return 0;
}

Assistant:

int main()
{
  std::vector<int> v;
  std::vector<int> v2(2,4);
  std::vector<int> v3(3,4);

  v.insert(v.begin(), v2.begin(), v3.end());

}